

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleiter.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::RuleCharacterIterator::lookahead
          (RuleCharacterIterator *this,UnicodeString *result,int32_t maxLookAhead)

{
  short sVar1;
  UnicodeString *src;
  int32_t length;
  int32_t *piVar2;
  int32_t srcLength;
  
  srcLength = 0x7fffffff;
  if ((uint)maxLookAhead < 0x7fffffff) {
    srcLength = maxLookAhead;
  }
  src = this->buf;
  if (src == (UnicodeString *)0x0) {
    src = this->text;
    piVar2 = &this->pos->index;
  }
  else {
    piVar2 = &this->bufPos;
  }
  sVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (result->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  UnicodeString::doReplace(result,0,length,src,*piVar2,srcLength);
  return result;
}

Assistant:

UnicodeString& RuleCharacterIterator::lookahead(UnicodeString& result, int32_t maxLookAhead) const {
    if (maxLookAhead < 0) {
        maxLookAhead = 0x7FFFFFFF;
    }
    if (buf != 0) {
        buf->extract(bufPos, maxLookAhead, result);
    } else {
        text.extract(pos.getIndex(), maxLookAhead, result);
    }
    return result;
}